

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O3

string * lest::make_string<C>(string *__return_storage_ptr__,C *ptr)

{
  uint *puVar1;
  long lVar2;
  ostringstream os;
  undefined1 auStack_198 [8];
  long local_190 [2];
  undefined8 uStack_180;
  uint auStack_178 [22];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffff4f | 0x10;
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 0x200;
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 0x12;
  lVar2 = *(long *)(local_190[0] + -0x18);
  if (acStack_b0[lVar2 + 1] == '\0') {
    std::ios::widen((char)auStack_198 + (char)lVar2 + '\b');
    acStack_b0[lVar2 + 1] = '\x01';
  }
  acStack_b0[lVar2] = '0';
  std::ostream::_M_insert<long>((long)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_string( T const * ptr )
{
    // Note showbase affects the behavior of /integer/ output;
    std::ostringstream os;
    os << std::internal << std::hex << std::showbase << std::setw( 2 + 2 * sizeof(T*) ) << std::setfill('0') << reinterpret_cast<std::ptrdiff_t>( ptr );
    return os.str();
}